

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpstream.cpp
# Opt level: O0

void __thiscall TCPStream::TCPStream(TCPStream *this,int sd,sockaddr_in *address)

{
  uint16_t uVar1;
  char local_58 [8];
  char ip [50];
  sockaddr_in *address_local;
  int sd_local;
  TCPStream *this_local;
  
  this->m_sd = sd;
  unique0x10000084 = address;
  std::__cxx11::string::string((string *)&this->m_peerIP);
  inet_ntop(2,&stack0xffffffffffffffe0->sin_addr,local_58,0x31);
  std::__cxx11::string::operator=((string *)&this->m_peerIP,local_58);
  uVar1 = ntohs(stack0xffffffffffffffe0->sin_port);
  this->m_peerPort = (uint)uVar1;
  return;
}

Assistant:

TCPStream::TCPStream(int sd, struct sockaddr_in* address) : m_sd(sd) {
    char ip[50];
    inet_ntop(PF_INET, (struct in_addr*)&(address->sin_addr.s_addr), ip, sizeof(ip)-1);
    m_peerIP = ip;
    m_peerPort = ntohs(address->sin_port);
}